

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O3

plutovg_path_t * plutovg_path_clone(plutovg_path_t *path)

{
  int iVar1;
  plutovg_path_element_t *__src;
  int iVar2;
  int iVar3;
  plutovg_path_t *ppVar4;
  plutovg_path_element_t *__dest;
  int capacity;
  
  ppVar4 = (plutovg_path_t *)malloc(0x28);
  ppVar4->ref_count = 1;
  (ppVar4->elements).data = (plutovg_path_element_t *)0x0;
  (ppVar4->elements).size = 0;
  (ppVar4->elements).capacity = 0;
  __src = (path->elements).data;
  if (__src != (plutovg_path_element_t *)0x0) {
    iVar1 = (path->elements).size;
    if (0 < (long)iVar1) {
      iVar2 = 8;
      do {
        iVar3 = iVar2;
        iVar2 = iVar3 * 2;
      } while (iVar3 < iVar1);
      __dest = (plutovg_path_element_t *)malloc((long)iVar3 << 3);
      (ppVar4->elements).data = __dest;
      (ppVar4->elements).capacity = iVar3;
      memcpy(__dest,__src,(long)iVar1 << 3);
      (ppVar4->elements).size = iVar1;
    }
  }
  ppVar4->start_point = path->start_point;
  iVar1 = path->num_contours;
  ppVar4->num_points = path->num_points;
  ppVar4->num_contours = iVar1;
  ppVar4->num_curves = path->num_curves;
  return ppVar4;
}

Assistant:

plutovg_path_t* plutovg_path_clone(const plutovg_path_t* path)
{
    plutovg_path_t* clone = plutovg_path_create();
    plutovg_array_append(clone->elements, path->elements);
    clone->start_point = path->start_point;
    clone->num_points = path->num_points;
    clone->num_contours = path->num_contours;
    clone->num_curves = path->num_curves;
    return clone;
}